

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

bool __thiscall cmGlobalGenerator::GenerateCPackPropertiesFile(cmGlobalGenerator *this)

{
  cmake *pcVar1;
  cmLocalGenerator *lg;
  bool bVar2;
  char *pcVar3;
  _Base_ptr p_Var4;
  string path;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  string config;
  cmCPackPropertiesGenerator cpackPropertiesGenerator;
  cmGeneratedFileStream file;
  char *local_358 [4];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_338;
  string local_318;
  cmCPackPropertiesGenerator local_2f8;
  cmGeneratedFileStream local_278;
  
  pcVar1 = this->CMakeInstance;
  lg = *(this->LocalGenerators).
        super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
        super__Vector_impl_data._M_start;
  local_338.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_338.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_338.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmMakefile::GetConfigurations(&local_318,lg->Makefile,&local_338,false);
  pcVar3 = cmake::GetHomeOutputDirectory(this->CMakeInstance);
  std::__cxx11::string::string((string *)local_358,pcVar3,(allocator *)&local_278);
  std::__cxx11::string::append((char *)local_358);
  bVar2 = cmsys::SystemTools::FileExists(local_358[0]);
  if ((bVar2) || ((pcVar1->InstalledFiles)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
    cmGeneratedFileStream::cmGeneratedFileStream(&local_278,local_358[0],false);
    std::operator<<((ostream *)&local_278,"# CPack properties\n");
    for (p_Var4 = (pcVar1->InstalledFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &(pcVar1->InstalledFiles)._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      cmCPackPropertiesGenerator::cmCPackPropertiesGenerator
                (&local_2f8,lg,(cmInstalledFile *)(p_Var4 + 2),&local_338);
      cmScriptGenerator::Generate
                (&local_2f8.super_cmScriptGenerator,(ostream *)&local_278,&local_318,&local_338);
      cmScriptGenerator::~cmScriptGenerator(&local_2f8.super_cmScriptGenerator);
    }
    cmGeneratedFileStream::~cmGeneratedFileStream(&local_278);
  }
  std::__cxx11::string::~string((string *)local_358);
  std::__cxx11::string::~string((string *)&local_318);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_338);
  return true;
}

Assistant:

bool cmGlobalGenerator::GenerateCPackPropertiesFile()
{
  cmake::InstalledFilesMap const& installedFiles =
    this->CMakeInstance->GetInstalledFiles();

  cmLocalGenerator* lg = this->LocalGenerators[0];
  cmMakefile* mf = lg->GetMakefile();

  std::vector<std::string> configs;
  std::string config = mf->GetConfigurations(configs, false);

  std::string path = this->CMakeInstance->GetHomeOutputDirectory();
  path += "/CPackProperties.cmake";

  if(!cmSystemTools::FileExists(path.c_str()) && installedFiles.empty())
    {
      return true;
    }

  cmGeneratedFileStream file(path.c_str());
  file << "# CPack properties\n";

  for(cmake::InstalledFilesMap::const_iterator i = installedFiles.begin();
    i != installedFiles.end(); ++i)
    {
    cmInstalledFile const& installedFile = i->second;

    cmCPackPropertiesGenerator cpackPropertiesGenerator(
      lg, installedFile, configs);

    cpackPropertiesGenerator.Generate(file, config, configs);
    }

  return true;
}